

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_5::TOutSliceInfo::TOutSliceInfo
          (TOutSliceInfo *this,PixelType t,char *b,size_t xs,size_t ys,bool z,int xtc,int ytc)

{
  bool z_local;
  size_t ys_local;
  size_t xs_local;
  char *b_local;
  PixelType t_local;
  TOutSliceInfo *this_local;
  
  this->type = t;
  this->base = b;
  this->xStride = xs;
  this->yStride = ys;
  this->zero = z;
  this->xTileCoords = xtc;
  this->yTileCoords = ytc;
  return;
}

Assistant:

TOutSliceInfo::TOutSliceInfo (PixelType t,
		              const char *b,
			      size_t xs, size_t ys,
			      bool z,
                              int xtc,
                              int ytc)
:
    type (t),
    base (b),
    xStride (xs),
    yStride (ys),
    zero (z),
    xTileCoords (xtc),
    yTileCoords (ytc)
{
    // empty
}